

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEditPrivate::updatePlaceholderVisibility(QPlainTextEditPrivate *this)

{
  long lVar1;
  char cVar2;
  char cVar3;
  QArrayData *pQVar4;
  byte bVar5;
  bool bVar6;
  
  cVar3 = this->field_0x348;
  lVar1 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate.field_0x8;
  pQVar4 = (QArrayData *)
           QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar1 + 8) + 800));
  cVar2 = QTextDocument::isEmpty();
  if (cVar2 == '\0') {
    bVar6 = false;
  }
  else {
    lVar1 = *(long *)(lVar1 + 8);
    pQVar4 = *(QArrayData **)(lVar1 + 0x308);
    lVar1 = *(long *)(lVar1 + 0x318);
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar6 = lVar1 != 0;
  }
  if (cVar2 == '\x01' && pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (-1 < cVar3 == bVar6) {
    QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
    lVar1 = *(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
    pQVar4 = (QArrayData *)
             QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(lVar1 + 8) + 800));
    cVar3 = QTextDocument::isEmpty();
    if (cVar3 == '\0') {
      bVar5 = 0;
    }
    else {
      lVar1 = *(long *)(lVar1 + 8);
      pQVar4 = *(QArrayData **)(lVar1 + 0x308);
      lVar1 = *(long *)(lVar1 + 0x318);
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar5 = (lVar1 != 0) << 7;
    }
    if (cVar3 == '\x01' && pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    this->field_0x348 = this->field_0x348 & 0x7f | bVar5;
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::updatePlaceholderVisibility()
{
    // We normally only repaint the part of view that contains text in the
    // document that has changed (in repaintContents). But the placeholder
    // text is not a part of the document, but is drawn on separately. So whenever
    // we either show or hide the placeholder text, we issue a full update.
    if (placeholderTextShown != placeHolderTextToBeShown()) {
        viewport->update();
        placeholderTextShown = placeHolderTextToBeShown();
    }
}